

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O0

void __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::CharMap
          (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this,unsigned_long defv
          )

{
  int local_1c;
  int i;
  unsigned_long defv_local;
  CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this_local;
  
  BVStatic<256UL>::BVStatic(&this->isInMap);
  this->defv = defv;
  this->root = (Type)0x0;
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    this->directMap[local_1c] = defv;
  }
  return;
}

Assistant:

CharMap(V defv)
            : defv(defv)
            , root(0)
        {
            for (int i = 0; i < directSize; i++)
                directMap[i] = defv;
        }